

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O2

void Kit_TruthCofSupports
               (Vec_Int_t *vBddDir,Vec_Int_t *vBddInv,int nVars,Vec_Int_t *vMemory,uint *puSupps)

{
  size_t __n;
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int *__src;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  
  uVar1 = nVars * 2;
  iVar10 = vBddDir->nSize * uVar1;
  if (vMemory->nSize < iVar10) {
    Vec_IntGrow(vMemory,iVar10);
  }
  piVar2 = vMemory->pArray;
  lVar13 = (long)(int)uVar1;
  __n = lVar13 * 4;
  memset(piVar2,0,__n);
  __src = (int *)0x0;
  uVar15 = 0;
  if (0 < (int)uVar1) {
    uVar15 = (ulong)uVar1;
  }
  lVar9 = 1;
  piVar14 = piVar2;
  while( true ) {
    piVar14 = piVar14 + lVar13;
    if (vBddDir->nSize <= lVar9) {
      memcpy(puSupps,__src,__n);
      iVar10 = vBddInv->nSize * uVar1;
      if (vMemory->nSize < iVar10) {
        Vec_IntGrow(vMemory,iVar10);
      }
      piVar2 = vMemory->pArray;
      memset(piVar2,0,__n);
      lVar9 = 1;
      piVar14 = piVar2;
      while( true ) {
        piVar14 = piVar14 + lVar13;
        if (vBddInv->nSize <= lVar9) {
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            uVar1 = puSupps[uVar12];
            uVar4 = (uint)(uVar12 >> 1) & 0x7fffffff;
            uVar6 = Kit_BitMask(uVar4);
            uVar3 = __src[uVar12];
            uVar4 = Kit_BitMask(uVar4);
            puSupps[uVar12] = ~uVar4 & uVar3 | uVar6 & uVar1;
          }
          return;
        }
        uVar3 = Vec_IntEntry(vBddInv,(int)lVar9);
        uVar6 = uVar3 & 0x1f;
        iVar5 = (uVar3 >> 0x11 & 0xfff) * uVar1;
        iVar10 = (uVar3 >> 5 & 0xfff) * uVar1;
        __src = piVar2 + lVar9 * lVar13;
        for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
          piVar14[uVar12] =
               piVar2[(long)iVar5 + uVar12] | 1 << (sbyte)uVar6 | piVar2[(long)iVar10 + uVar12];
        }
        uVar12 = (ulong)(uVar6 * 2 + 1);
        if (piVar2[(long)iVar5 + (ulong)uVar6 * 2] != piVar2[(long)iVar5 + uVar12]) break;
        if (piVar2[(long)iVar10 + (ulong)(uVar6 * 2)] != piVar2[(long)iVar10 + uVar12]) {
          __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                        ,0x16a,
                        "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                       );
        }
        *(int *)((long)__src + (ulong)(uVar6 << 3)) = piVar2[(long)iVar5 + (ulong)uVar6 * 2];
        __src[uVar12] = *(int *)((long)piVar2 + (ulong)(uVar6 << 3) + (long)iVar10 * 4);
        lVar9 = lVar9 + 1;
      }
      __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                    ,0x169,
                    "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                   );
    }
    uVar3 = Vec_IntEntry(vBddDir,(int)lVar9);
    iVar5 = (~uVar3 | 0xffffffe0) + nVars;
    iVar8 = (uVar3 >> 0x11 & 0xfff) * uVar1;
    iVar10 = (uVar3 >> 5 & 0xfff) * uVar1;
    __src = piVar2 + lVar9 * lVar13;
    for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
      piVar14[uVar12] =
           piVar2[(long)iVar8 + uVar12] | 1 << ((byte)iVar5 & 0x1f) | piVar2[(long)iVar10 + uVar12];
    }
    lVar11 = (long)(iVar5 * 2);
    lVar7 = (long)(iVar5 * 2 + 1);
    if (piVar2[iVar8 + lVar11] != piVar2[iVar8 + lVar7]) break;
    if (piVar2[iVar10 + lVar11] != piVar2[iVar10 + lVar7]) {
      __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                    ,0x150,
                    "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                   );
    }
    __src[lVar11] = piVar2[iVar8 + lVar11];
    __src[lVar7] = piVar2[iVar10 + lVar11];
    lVar9 = lVar9 + 1;
  }
  __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                ,0x14f,
                "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
               );
}

Assistant:

void Kit_TruthCofSupports( Vec_Int_t * vBddDir, Vec_Int_t * vBddInv, int nVars, Vec_Int_t * vMemory, unsigned * puSupps )
{
    Kit_Mux_t Mux;
    unsigned * puSuppAll;
    unsigned * pThis = NULL; // Suppress "might be used uninitialized"
    unsigned * pFan0, * pFan1;
    int i, v, Var, Entry, nSupps;
    nSupps = 2 * nVars;

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddDir) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddDir) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddDir, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        Var = nVars - 1 - Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }
    // copy the result
    memcpy( puSupps, pThis, sizeof(unsigned) * nSupps );
    // compute the inverse

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddInv) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddInv) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddInv, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
//        Var = nVars - 1 - Mux.v;
        Var = Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }

    // merge supports
    for ( Var = 0; Var < nSupps; Var++ )
        puSupps[Var] = (puSupps[Var] & Kit_BitMask(Var/2)) | (pThis[Var] & ~Kit_BitMask(Var/2));
}